

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_getClockTime(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int *in_RCX;
  vm_val_t *in_RDX;
  uint *in_RDI;
  int32_t daytime;
  int32_t dayno;
  uint argc;
  undefined4 in_stack_ffffffffffffffa8;
  int n;
  int iVar2;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  CVmObjDate *in_stack_ffffffffffffffc0;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  iVar2 = n;
  if ((getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getClockTime::desc,0,1);
    __cxa_guard_release(&getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_RDI,(CVmNativeCodeDesc *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    get_tz_arg(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    get_local_time(in_stack_ffffffffffffffc0,
                   (int32_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   (int32_t *)in_RDI,(CVmTimeZone *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
    make_int_list(in_RDX,4,(ulong)(uint)((int)in_stack_ffffffffffffffbc / 3600000),
                  (long)((ulong)(uint)((int)((long)(int)in_stack_ffffffffffffffbc / 60000) >> 0x1f)
                         << 0x20 | (long)(int)in_stack_ffffffffffffffbc / 60000 & 0xffffffffU) %
                  0x3c & 0xffffffff,
                  (long)((ulong)(uint)((int)((long)(int)in_stack_ffffffffffffffbc / 1000) >> 0x1f)
                         << 0x20 | (long)(int)in_stack_ffffffffffffffbc / 1000 & 0xffffffffU) % 0x3c
                  & 0xffffffff,(long)(int)in_stack_ffffffffffffffbc % 1000 & 0xffffffff);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getClockTime(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date and time in local time */
    int32_t dayno, daytime;
    get_local_time(dayno, daytime, get_tz_arg(vmg_ 0, argc));

    /* return [hour, minute, second, msec] */
    make_int_list(vmg_ retval, 4,
                  daytime/(60*60*1000),
                  daytime/(60*1000) % 60,
                  daytime/(1000) % 60,
                  daytime % 1000);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}